

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBSRAMPlus.hpp
# Opt level: O2

void __thiscall
Atari2600::Cartridge::CBSRAMPlus::perform_bus_operation
          (CBSRAMPlus *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  ushort uVar1;
  uint uVar2;
  
  uVar2 = (uint)address;
  uVar1 = (ushort)(uVar2 & 0x1fff);
  if (0xfff < uVar1) {
    if ((ushort)(uVar1 + 0xe008) < 3) {
      this->rom_ptr_ =
           (this->super_BusExtender).rom_base_ + ((ulong)((uVar2 & 0x1fff) << 0xc) - 0x1ff8000);
    }
    if ((int)operation < 5) {
      *value = this->rom_ptr_[uVar2 & 0xfff];
    }
    if (uVar1 < 0x1100) {
      this->ram_[uVar2 & 0xff] = *value;
      return;
    }
    if (uVar1 < 0x1200 && (int)operation < 5) {
      *value = this->ram_[uVar2 & 0xff];
      return;
    }
  }
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			address &= 0x1fff;
			if(!(address & 0x1000)) return;

			if(address >= 0x1ff8 && address <= 0x1ffa) rom_ptr_ = rom_base_ + (address - 0x1ff8) * 4096;

			if(isReadOperation(operation)) {
				*value = rom_ptr_[address & 4095];
			}

			if(address < 0x1100) ram_[address & 0xff] = *value;
			else if(address < 0x1200 && isReadOperation(operation)) *value = ram_[address & 0xff];
		}